

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

void __thiscall
Assimp::glTFExporter::glTFExporter
          (glTFExporter *this,char *filename,IOSystem *pIOSystem,aiScene *pScene,
          ExportProperties *pProperties,bool isBinary)

{
  Asset *this_00;
  element_type *peVar1;
  undefined1 local_108 [8];
  AssetWriter writer;
  SplitLargeMeshesProcess_Vertex vert_splitter;
  SplitLargeMeshesProcess_Triangle tri_splitter;
  aiScene *sceneCopy;
  aiScene *local_40;
  aiScene *sceneCopy_tmp;
  ExportProperties *pEStack_30;
  bool isBinary_local;
  ExportProperties *pProperties_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *filename_local;
  glTFExporter *this_local;
  
  this->mFilename = filename;
  this->mIOSystem = pIOSystem;
  this->mProperties = pProperties;
  sceneCopy_tmp._7_1_ = isBinary;
  pEStack_30 = pProperties;
  pProperties_local = (ExportProperties *)pScene;
  pScene_local = (aiScene *)pIOSystem;
  pIOSystem_local = (IOSystem *)filename;
  filename_local = (char *)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map(&this->mTexturesByPath);
  std::shared_ptr<glTF::Asset>::shared_ptr(&this->mAsset);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mBodyData);
  SceneCombiner::CopyScene(&local_40,(aiScene *)pProperties_local,true);
  SplitLargeMeshesProcess_Triangle::SplitLargeMeshesProcess_Triangle
            ((SplitLargeMeshesProcess_Triangle *)&vert_splitter.LIMIT);
  SplitLargeMeshesProcess_Triangle::SetLimit
            ((SplitLargeMeshesProcess_Triangle *)&vert_splitter.LIMIT,0xffff);
  SplitLargeMeshesProcess_Triangle::Execute
            ((SplitLargeMeshesProcess_Triangle *)&vert_splitter.LIMIT,local_40);
  SplitLargeMeshesProcess_Vertex::SplitLargeMeshesProcess_Vertex
            ((SplitLargeMeshesProcess_Vertex *)&writer.mAl);
  SplitLargeMeshesProcess_Vertex::SetLimit((SplitLargeMeshesProcess_Vertex *)&writer.mAl,0xffff);
  SplitLargeMeshesProcess_Vertex::Execute((SplitLargeMeshesProcess_Vertex *)&writer.mAl,local_40);
  this->mScene = local_40;
  this_00 = (Asset *)operator_new(0x778);
  glTF::Asset::Asset(this_00,(IOSystem *)pScene_local);
  std::__shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>::reset<glTF::Asset>
            (&(this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>,this_00);
  if ((sceneCopy_tmp._7_1_ & 1) != 0) {
    peVar1 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    glTF::Asset::SetAsBinary(peVar1);
  }
  ExportMetadata(this);
  ExportMaterials(this);
  if (this->mScene->mRootNode != (aiNode *)0x0) {
    ExportNodeHierarchy(this,this->mScene->mRootNode);
  }
  ExportMeshes(this);
  ExportScene(this);
  ExportAnimations(this);
  peVar1 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &this->mAsset);
  glTF::AssetWriter::AssetWriter((AssetWriter *)local_108,peVar1);
  if ((sceneCopy_tmp._7_1_ & 1) == 0) {
    glTF::AssetWriter::WriteFile((AssetWriter *)local_108,(char *)pIOSystem_local);
  }
  else {
    glTF::AssetWriter::WriteGLBFile((AssetWriter *)local_108,(char *)pIOSystem_local);
  }
  glTF::AssetWriter::~AssetWriter((AssetWriter *)local_108);
  SplitLargeMeshesProcess_Vertex::~SplitLargeMeshesProcess_Vertex
            ((SplitLargeMeshesProcess_Vertex *)&writer.mAl);
  SplitLargeMeshesProcess_Triangle::~SplitLargeMeshesProcess_Triangle
            ((SplitLargeMeshesProcess_Triangle *)&vert_splitter.LIMIT);
  return;
}

Assistant:

glTFExporter::glTFExporter(const char* filename, IOSystem* pIOSystem, const aiScene* pScene,
                           const ExportProperties* pProperties, bool isBinary)
    : mFilename(filename)
    , mIOSystem(pIOSystem)
    , mProperties(pProperties)
{
    aiScene* sceneCopy_tmp;
    SceneCombiner::CopyScene(&sceneCopy_tmp, pScene);
    aiScene *sceneCopy(sceneCopy_tmp);

    SplitLargeMeshesProcess_Triangle tri_splitter;
    tri_splitter.SetLimit(0xffff);
    tri_splitter.Execute(sceneCopy);

    SplitLargeMeshesProcess_Vertex vert_splitter;
    vert_splitter.SetLimit(0xffff);
    vert_splitter.Execute(sceneCopy);

    mScene = sceneCopy;

    mAsset.reset( new glTF::Asset( pIOSystem ) );

    if (isBinary) {
        mAsset->SetAsBinary();
    }

    ExportMetadata();

    //for (unsigned int i = 0; i < pScene->mNumCameras; ++i) {}

    //for (unsigned int i = 0; i < pScene->mNumLights; ++i) {}

    ExportMaterials();

    if (mScene->mRootNode) {
        ExportNodeHierarchy(mScene->mRootNode);
    }

    ExportMeshes();

    //for (unsigned int i = 0; i < pScene->mNumTextures; ++i) {}

    ExportScene();

    ExportAnimations();

    glTF::AssetWriter writer(*mAsset);

    if (isBinary) {
        writer.WriteGLBFile(filename);
    } else {
        writer.WriteFile(filename);
    }
}